

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3IndexAffinityStr(sqlite3 *db,Index *pIdx)

{
  short sVar1;
  Table *pTVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  if (pIdx->zColAff == (char *)0x0) {
    pTVar2 = pIdx->pTable;
    pcVar4 = (char *)sqlite3Malloc((ulong)pIdx->nColumn + 1);
    pIdx->zColAff = pcVar4;
    if (pcVar4 == (char *)0x0) {
      sqlite3OomFault(db);
    }
    else {
      if (pIdx->nColumn == 0) {
        uVar6 = 0;
      }
      else {
        lVar5 = 4;
        uVar6 = 0;
        do {
          sVar1 = pIdx->aiColumn[uVar6];
          if ((long)sVar1 < 0) {
            if (sVar1 == -1) {
              cVar3 = 'D';
            }
            else {
              cVar3 = sqlite3ExprAffinity(*(Expr **)((long)pIdx->aColExpr->a + lVar5 * 2 + -8));
            }
          }
          else {
            cVar3 = pTVar2->aCol[sVar1].affinity;
          }
          if (cVar3 < 'B') {
            cVar3 = 'A';
          }
          if ('B' < cVar3) {
            cVar3 = 'C';
          }
          pIdx->zColAff[uVar6] = cVar3;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xc;
        } while (uVar6 < pIdx->nColumn);
      }
      pIdx->zColAff[uVar6] = '\0';
    }
    if (pcVar4 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  return pIdx->zColAff;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(sqlite3 *db, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+1);
    if( !pIdx->zColAff ){
      sqlite3OomFault(db);
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      i16 x = pIdx->aiColumn[n];
      char aff;
      if( x>=0 ){
        aff = pTab->aCol[x].affinity;
      }else if( x==XN_ROWID ){
        aff = SQLITE_AFF_INTEGER;
      }else{
        assert( x==XN_EXPR );
        assert( pIdx->bHasExpr );
        assert( pIdx->aColExpr!=0 );
        aff = sqlite3ExprAffinity(pIdx->aColExpr->a[n].pExpr);
      }
      if( aff<SQLITE_AFF_BLOB ) aff = SQLITE_AFF_BLOB;
      if( aff>SQLITE_AFF_NUMERIC) aff = SQLITE_AFF_NUMERIC;
      pIdx->zColAff[n] = aff;
    }
    pIdx->zColAff[n] = 0;
  }

  return pIdx->zColAff;
}